

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JUnitTestOutput.cpp
# Opt level: O0

void __thiscall JUnitTestOutput::JUnitTestOutput(JUnitTestOutput *this)

{
  JUnitTestOutputImpl *this_00;
  JUnitTestOutput *this_local;
  
  TestOutput::TestOutput(&this->super_TestOutput);
  (this->super_TestOutput)._vptr_TestOutput = (_func_int **)&PTR__JUnitTestOutput_003684c0;
  this_00 = (JUnitTestOutputImpl *)
            operator_new(0x70,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/src/CppUTest/JUnitTestOutput.cpp"
                         ,0x4d);
  JUnitTestOutputImpl::JUnitTestOutputImpl(this_00);
  this->impl_ = this_00;
  return;
}

Assistant:

JUnitTestOutput::JUnitTestOutput() :
    impl_(new JUnitTestOutputImpl)
{
}